

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmHexFileConverter.cxx
# Opt level: O0

FileType cmHexFileConverter::DetermineFileType(char *inFileName)

{
  bool bVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  uint local_468;
  uint i;
  uint slen;
  uint maxLineLength;
  uint minLineLength;
  FileType type;
  allocator local_441;
  string local_440;
  FILE *local_420;
  FILE *inFile;
  char buf [1024];
  char *inFileName_local;
  
  buf._1016_8_ = inFileName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,inFileName,&local_441);
  __stream = (FILE *)cmsys::SystemTools::Fopen(&local_440,"rb");
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  if (__stream == (FILE *)0x0) {
    inFileName_local._4_4_ = Binary;
  }
  else {
    local_420 = __stream;
    pcVar3 = fgets((char *)&inFile,0x400,__stream);
    if (pcVar3 == (char *)0x0) {
      inFile._0_1_ = '\0';
    }
    fclose(local_420);
    if ((char)inFile == ':') {
      maxLineLength = 1;
      slen = 0xb;
      i = 0x20b;
    }
    else {
      if ((char)inFile != 'S') {
        return Binary;
      }
      maxLineLength = 2;
      slen = 10;
      i = 0x20e;
    }
    uVar2 = ChompStrlen((char *)&inFile);
    if ((uVar2 < slen) || (i < uVar2)) {
      inFileName_local._4_4_ = Binary;
    }
    else {
      for (local_468 = 1; local_468 < uVar2; local_468 = local_468 + 1) {
        bVar1 = cm_IsHexChar(buf[(ulong)local_468 - 8]);
        if (!bVar1) {
          return Binary;
        }
      }
      inFileName_local._4_4_ = maxLineLength;
    }
  }
  return inFileName_local._4_4_;
}

Assistant:

cmHexFileConverter::FileType cmHexFileConverter::DetermineFileType(
                                                        const char* inFileName)
{
  char buf[1024];
  FILE* inFile = cmsys::SystemTools::Fopen(inFileName, "rb");
  if (inFile == 0)
    {
    return Binary;
    }

  if(!fgets(buf, 1024, inFile))
    {
    buf[0] = 0;
    }
  fclose(inFile);
  FileType type = Binary;
  unsigned int minLineLength = 0;
  unsigned int maxLineLength = 0;
  if (buf[0] == ':') // might be an intel hex file
    {
    type = IntelHex;
    minLineLength = INTEL_HEX_MIN_LINE_LENGTH;
    maxLineLength = INTEL_HEX_MAX_LINE_LENGTH;
    }
  else if (buf[0] == 'S') // might be a motorola srec file
    {
    type = MotorolaSrec;
    minLineLength = MOTOROLA_SREC_MIN_LINE_LENGTH;
    maxLineLength = MOTOROLA_SREC_MAX_LINE_LENGTH;
    }
  else
    {
    return Binary;
    }

  unsigned int slen = ChompStrlen(buf);
  if ((slen < minLineLength) || (slen > maxLineLength))
    {
    return Binary;
    }

  for (unsigned int i = 1; i < slen; i++)
    {
    if (!cm_IsHexChar(buf[i]))
      {
      return Binary;
      }
    }
  return type;
}